

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

void addEpochs<CoreML::Specification::NeuralNetwork>
               (NeuralNetwork *nn,int64_t defaultValue,int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  bool bVar1;
  NetworkUpdateParameters *this;
  Int64Parameter *this_00;
  size_type sVar2;
  Int64Range *this_01;
  Int64Set *this_02;
  reference plVar3;
  long *x;
  iterator __end2;
  iterator __begin2;
  set<long,_std::less<long>,_std::allocator<long>_> *__range2;
  Int64Set *int64Set;
  Int64Range *int64Range;
  Int64Parameter *epochs;
  NetworkUpdateParameters *updateParameters;
  set<long,_std::less<long>,_std::allocator<long>_> *allowedValues_local;
  int64_t maxValue_local;
  int64_t minValue_local;
  int64_t defaultValue_local;
  NeuralNetwork *nn_local;
  
  this = CoreML::Specification::NeuralNetwork::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_epochs(this);
  CoreML::Specification::Int64Parameter::set_defaultvalue(this_00,defaultValue);
  sVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::size(allowedValues);
  if (sVar2 == 0) {
    this_01 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    CoreML::Specification::Int64Range::set_minvalue(this_01,minValue);
    CoreML::Specification::Int64Range::set_maxvalue(this_01,maxValue);
  }
  else {
    this_02 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    __end2 = std::set<long,_std::less<long>,_std::allocator<long>_>::begin(allowedValues);
    x = (long *)std::set<long,_std::less<long>,_std::allocator<long>_>::end(allowedValues);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&x), bVar1) {
      plVar3 = std::_Rb_tree_const_iterator<long>::operator*(&__end2);
      CoreML::Specification::Int64Set::add_values(this_02,*plVar3);
      std::_Rb_tree_const_iterator<long>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void addEpochs(NeuralNetworkClass *nn, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto epochs = updateParameters->mutable_epochs();
    
    epochs->set_defaultvalue(defaultValue);
    
    if (allowedValues.size() == 0) {
        auto int64Range = epochs->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = epochs->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}